

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive.cpp
# Opt level: O0

void __thiscall
SerializeBufferReader_ReadByte_Test::TestBody(SerializeBufferReader_ReadByte_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_68;
  Message local_60 [3];
  uchar local_45;
  int local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  buffer_reader reader;
  array<unsigned_char,_1UL> buffer;
  SerializeBufferReader_ReadByte_Test *this_local;
  
  reader.last_._7_1_ = 0x1c;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<unsigned_char,1ul>
                   ((array<unsigned_char,_1UL> *)((long)&reader.last_ + 7));
  pstore::serialize::archive::buffer_reader::buffer_reader<pstore::gsl::span<unsigned_char,1l>>
            ((buffer_reader *)local_28,
             (span<unsigned_char,_1L>)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  local_44 = 0x1c;
  local_45 = pstore::serialize::archive::buffer_reader::get<unsigned_char>
                       ((buffer_reader *)local_28);
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_40,"28","reader.get<std::uint8_t> ()",&local_44,&local_45);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_archive.cpp"
               ,0x68,message);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

TEST (SerializeBufferReader, ReadByte) {
    std::array<std::uint8_t, 1> buffer{{28}};
    pstore::serialize::archive::buffer_reader reader (::pstore::gsl::make_span (buffer));
    EXPECT_EQ (28, reader.get<std::uint8_t> ());
}